

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::ComplexOptionType1::ByteSizeLong(ComplexOptionType1 *this)

{
  RepeatedField<int> *value;
  long lVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  
  sVar3 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  value = &(this->field_0)._impl_.foo4_;
  sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(value);
  uVar2 = google::protobuf::RepeatedField<int>::size(value);
  sVar3 = sVar4 + sVar3 + (ulong)uVar2;
  uVar2 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar2 & 7) != 0) {
    if ((uVar2 & 1) != 0) {
      uVar5 = (long)(this->field_0)._impl_.foo_ | 1;
      lVar1 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
    if ((uVar2 & 2) != 0) {
      uVar5 = (long)(this->field_0)._impl_.foo2_ | 1;
      lVar1 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
    if ((uVar2 & 4) != 0) {
      uVar5 = (long)(this->field_0)._impl_.foo3_ | 1;
      lVar1 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t ComplexOptionType1::ByteSizeLong() const {
  const ComplexOptionType1& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.ComplexOptionType1)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 foo4 = 4;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_foo4());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_foo4_size());
      total_size += tag_size + data_size;
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional int32 foo = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_foo());
    }
    // optional int32 foo2 = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_foo2());
    }
    // optional int32 foo3 = 3;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_foo3());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}